

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

Kit_Graph_t * Kit_TruthToGraph2(uint *pTruth0,uint *pTruth1,int nVars,Vec_Int_t *vMemory)

{
  int fCompl;
  int iVar1;
  int RetValue;
  Kit_Graph_t *pGraph;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  uint *pTruth1_local;
  uint *pTruth0_local;
  
  fCompl = Kit_TruthIsop2(pTruth0,pTruth1,nVars,vMemory,1,0);
  if (fCompl == -1) {
    pTruth0_local = (uint *)0x0;
  }
  else {
    iVar1 = Vec_IntSize(vMemory);
    if (iVar1 < 0x10001) {
      if ((fCompl != 0) && (fCompl != 1)) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitGraph.c"
                      ,0x18a,
                      "Kit_Graph_t *Kit_TruthToGraph2(unsigned int *, unsigned int *, int, Vec_Int_t *)"
                     );
      }
      pTruth0_local = (uint *)Kit_SopFactor(vMemory,fCompl,nVars,vMemory);
    }
    else {
      pTruth0_local = (uint *)0x0;
    }
  }
  return (Kit_Graph_t *)pTruth0_local;
}

Assistant:

Kit_Graph_t * Kit_TruthToGraph2( unsigned * pTruth0, unsigned * pTruth1, int nVars, Vec_Int_t * vMemory )
{
    Kit_Graph_t * pGraph;
    int RetValue;
    // derive SOP
    RetValue = Kit_TruthIsop2( pTruth0, pTruth1, nVars, vMemory, 1, 0 ); // tried 1 and found not useful in "renode"
    if ( RetValue == -1 )
        return NULL;
    if ( Vec_IntSize(vMemory) > (1<<16) )
        return NULL;
//    printf( "Isop size = %d.\n", Vec_IntSize(vMemory) );
    assert( RetValue == 0 || RetValue == 1 );
    // derive factored form
    pGraph = Kit_SopFactor( vMemory, RetValue, nVars, vMemory );
    return pGraph;
}